

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O3

void Kit_SopDivideByLiteralQuo(Kit_Sop_t *cSop,int iLit)

{
  uint uVar1;
  uint *puVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  iVar5 = cSop->nCubes;
  if (iVar5 < 1) {
    iVar4 = 0;
  }
  else {
    bVar3 = (byte)iLit & 0x1f;
    puVar2 = cSop->pCubes;
    lVar7 = 0;
    iVar4 = 0;
    do {
      uVar1 = puVar2[lVar7];
      if (uVar1 == 0) break;
      if ((uVar1 & 1 << ((byte)iLit & 0x1f)) != 0) {
        lVar6 = (long)iVar4;
        iVar4 = iVar4 + 1;
        puVar2[lVar6] = uVar1 & (-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
        iVar5 = cSop->nCubes;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar5);
  }
  cSop->nCubes = iVar4;
  return;
}

Assistant:

void Kit_SopDivideByLiteralQuo( Kit_Sop_t * cSop, int iLit )
{
    unsigned uCube;
    int i, k = 0;
    Kit_SopForEachCube( cSop, uCube, i )
    {
        if ( Kit_CubeHasLit(uCube, iLit) )
            Kit_SopWriteCube( cSop, Kit_CubeRemLit(uCube, iLit), k++ );
    }
    Kit_SopShrink( cSop, k );
}